

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall glslang::TFunction::addParameter(TFunction *this,TParameter *p)

{
  TParameter *p_local;
  TFunction *this_local;
  
  if (((this->super_TSymbol).writable & 1U) != 0) {
    std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>::push_back
              (&(this->parameters).
                super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>,p);
    TType::appendMangledName(p->type,&this->mangledName);
    if (p->defaultValue != (TIntermTyped *)0x0) {
      this->defaultParamCount = this->defaultParamCount + 1;
    }
    return;
  }
  __assert_fail("writable",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x10e,"virtual void glslang::TFunction::addParameter(TParameter &)");
}

Assistant:

virtual void addParameter(TParameter& p)
    {
        assert(writable);
        parameters.push_back(p);
        p.type->appendMangledName(mangledName);

        if (p.defaultValue != nullptr)
            defaultParamCount++;
    }